

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketHandshake.h
# Opt level: O0

void uWS::WebSocketHandshake::generate(char *input,char *output)

{
  undefined4 uVar1;
  long lVar2;
  char *in_RSI;
  long in_RDI;
  char *bytes;
  uint32_t tmp;
  int i_1;
  uint32_t last_b [16];
  int i;
  uint32_t b_input [16];
  uint32_t b_output [5];
  int local_bc;
  undefined1 local_b8 [16];
  uint32_t *in_stack_ffffffffffffff58;
  uint32_t *in_stack_ffffffffffffff60;
  int local_6c;
  undefined4 local_68 [16];
  uchar local_28 [24];
  char *local_10;
  long local_8;
  
  local_28[0] = '\x01';
  local_28[1] = '#';
  local_28[2] = 'E';
  local_28[3] = 'g';
  local_28[4] = 0x89;
  local_28[5] = 0xab;
  local_28[6] = 0xcd;
  local_28[7] = 0xef;
  local_28[8] = 0xfe;
  local_28[9] = 0xdc;
  local_28[10] = 0xba;
  local_28[0xb] = 0x98;
  local_28[0xc] = 'v';
  local_28[0xd] = 'T';
  local_28[0xe] = '2';
  local_28[0xf] = '\x10';
  local_28[0x10] = 0xf0;
  local_28[0x11] = 0xe1;
  local_28[0x12] = 0xd2;
  local_28[0x13] = 0xc3;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memcpy(local_68,&DAT_0027e640,0x40);
  for (local_6c = 0; local_6c < 6; local_6c = local_6c + 1) {
    local_68[local_6c] =
         CONCAT13(*(undefined1 *)(local_8 + (local_6c << 2)),
                  CONCAT12(*(undefined1 *)(local_8 + (local_6c * 4 + 1)),
                           CONCAT11(*(undefined1 *)(local_8 + (local_6c * 4 + 2)),
                                    *(undefined1 *)(local_8 + (local_6c * 4 + 3)))));
  }
  sha1(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  memset(local_b8,0,0x40);
  sha1(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  for (local_bc = 0; local_bc < 5; local_bc = local_bc + 1) {
    uVar1 = *(undefined4 *)(local_28 + (long)local_bc * 4);
    lVar2 = (long)local_bc * 4;
    local_28[lVar2 + 3] = (uchar)uVar1;
    local_28[lVar2 + 2] = (uchar)((uint)uVar1 >> 8);
    local_28[lVar2 + 1] = (uchar)((uint)uVar1 >> 0x10);
    local_28[lVar2] = (uchar)((uint)uVar1 >> 0x18);
  }
  base64(local_28,local_10);
  return;
}

Assistant:

static inline void generate(const char input[24], char output[28]) {
        uint32_t b_output[5] = {
            0x67452301, 0xefcdab89, 0x98badcfe, 0x10325476, 0xc3d2e1f0
        };
        uint32_t b_input[16] = {
            0, 0, 0, 0, 0, 0, 0x32353845, 0x41464135, 0x2d453931, 0x342d3437, 0x44412d39,
            0x3543412d, 0x43354142, 0x30444338, 0x35423131, 0x80000000
        };

        for (int i = 0; i < 6; i++) {
            b_input[i] = (input[4 * i + 3] & 0xff) | (input[4 * i + 2] & 0xff) << 8 | (input[4 * i + 1] & 0xff) << 16 | (input[4 * i + 0] & 0xff) << 24;
        }
        sha1(b_output, b_input);
        uint32_t last_b[16] = {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 480};
        sha1(b_output, last_b);
        for (int i = 0; i < 5; i++) {
            uint32_t tmp = b_output[i];
            char *bytes = (char *) &b_output[i];
            bytes[3] = (char) (tmp & 0xff);
            bytes[2] = (char) ((tmp >> 8) & 0xff);
            bytes[1] = (char) ((tmp >> 16) & 0xff);
            bytes[0] = (char) ((tmp >> 24) & 0xff);
        }
        base64((unsigned char *) b_output, output);
    }